

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O2

int __thiscall
wabt::string_view::compare(string_view *this,size_type pos1,size_type n1,char *s,size_type n2)

{
  int iVar1;
  string_view s_00;
  string_view local_28;
  
  local_28 = substr(this,pos1,n1);
  s_00.size_ = n2;
  s_00.data_ = s;
  iVar1 = compare(&local_28,s_00);
  return iVar1;
}

Assistant:

int string_view::compare(size_type pos1,
                         size_type n1,
                         const char* s,
                         size_type n2) const {
  return substr(pos1, n1).compare(string_view(s, n2));
}